

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O2

void Fra_FraigSweep(Fra_Man_t *p)

{
  int iVar1;
  Fra_Par_t *pFVar2;
  int Pos;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar6;
  int iVar7;
  int i;
  
  pAVar4 = p->pManAig;
  Pos = 0;
  for (iVar7 = pAVar4->nObjs[2] - pAVar4->nRegs; iVar7 < pAVar4->vCis->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar4->vCis,iVar7);
    Fra_FraigNode(p,pAVar3);
    if (p->pPars->fUseImps != 0) {
      Pos = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar3,Pos);
    }
    pAVar4 = p->pManAig;
  }
  if (p->pPars->fLatchCorr == 0) {
    iVar7 = p->pPars->nBTLimitNode;
    for (i = 0; i < pAVar4->vObjs->nSize; i = i + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar4->vObjs,i);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fra.h"
                        ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
        }
        iVar1 = p->pPars->nFramesK;
        uVar5 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                   *(ulong *)(*(long *)(*(long *)(uVar5 + 0x28) + 0x20) +
                             (long)(*(int *)(uVar5 + 0x24) *
                                    *(int *)(*(long *)(uVar5 + 0x28) + 0x18) + iVar1) * 8));
        }
        uVar5 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)pAVar3->pFanin1 & 1) ^
               *(ulong *)(*(long *)(*(long *)(uVar5 + 0x28) + 0x20) +
                         (long)(*(int *)(uVar5 + 0x24) * *(int *)(*(long *)(uVar5 + 0x28) + 0x18) +
                               iVar1) * 8));
        }
        pAVar6 = Aig_And(p->pManFraig,pAVar6,p1);
        *(Aig_Obj_t **)
         (*(long *)((long)(pAVar3->field_5).pData + 0x20) +
         ((long)pAVar3->Id * (long)*(int *)((long)(pAVar3->field_5).pData + 0x18) +
         (long)p->pPars->nFramesK) * 8) = pAVar6;
        *(Fra_Man_t **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x28) = p;
        if (p->pManFraig->pData == (void *)0x0) {
          iVar1 = p->pPars->nLevelMax;
          if ((iVar1 != 0) && (iVar1 < (int)(*(uint *)&pAVar3->field_0x1c & 0xffffff))) {
            p->pPars->nBTLimitNode = 5;
          }
          Fra_FraigNode(p,pAVar3);
          pFVar2 = p->pPars;
          if ((pFVar2->nLevelMax != 0) &&
             (pFVar2->nLevelMax < (int)(*(uint *)&pAVar3->field_0x1c & 0xffffff))) {
            pFVar2->nBTLimitNode = iVar7;
          }
          if (pFVar2->fUseImps != 0) {
            Pos = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar3,Pos);
          }
        }
      }
      pAVar4 = p->pManAig;
    }
    p->nNodesMiter = p->pManFraig->nObjs[6] + p->pManFraig->nObjs[5];
    if (p->pPars->fUseImps != 0) {
      Fra_ImpCompactArray(p->pCla->vImps);
      return;
    }
  }
  return;
}

Assistant:

void Fra_FraigSweep( Fra_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, Pos = 0;
    int nBTracksOld;
    // fraig latch outputs
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Fra_FraigNode( p, pObj );
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
    if ( p->pPars->fLatchCorr )
        return;
    // fraig internal nodes
//    if ( !p->pPars->fDontShowBar )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pManAig) );
    nBTracksOld = p->pPars->nBTLimitNode;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
//        if ( pProgress )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // derive and remember the new fraig node
        pObjNew = Aig_And( p->pManFraig, Fra_ObjChild0Fra(pObj,p->pPars->nFramesK), Fra_ObjChild1Fra(pObj,p->pPars->nFramesK) );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjNew );
        Aig_Regular(pObjNew)->pData = p;
        // quit if simulation detected a counter-example for a PO
        if ( p->pManFraig->pData )
            continue;
//        if ( Aig_SupportSize(p->pManAig,pObj) > 16 )
//            continue;
        // perform fraiging
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = 5;
        Fra_FraigNode( p, pObj );
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = nBTracksOld;
        // check implications
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
//    if ( pProgress )
//        Bar_ProgressStop( pProgress );
    // try to prove the outputs of the miter
    p->nNodesMiter = Aig_ManNodeNum(p->pManFraig);
//    Fra_MiterStatus( p->pManFraig );
//    if ( p->pPars->fProve && p->pManFraig->pData == NULL )
//        Fra_MiterProve( p );
    // compress implications after processing all of them
    if ( p->pPars->fUseImps )
        Fra_ImpCompactArray( p->pCla->vImps );
}